

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int commit_send_packet(quicly_conn_t *conn,quicly_send_context_t *s,
                      en_quicly_send_packet_mode_t mode)

{
  size_t *psVar1;
  uint64_t *puVar2;
  quicly_sentmap_t *map;
  ushort uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  st_quicly_cipher_context_t *psVar7;
  ptls_aead_context_t *ppVar8;
  size_t sVar9;
  st_quicly_crypto_engine_t *psVar10;
  quicly_sent_t *pqVar11;
  _func_void_void_ptr_char_ptr_varargs *p_Var12;
  iovec *piVar13;
  uint64_t uVar14;
  long lVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  st_quicly_sent_block_t *psVar20;
  uint uVar21;
  ulong uVar22;
  int unaff_EBP;
  byte bVar23;
  undefined8 uVar24;
  ulong uVar25;
  long *in_FS_OFFSET;
  ptls_iovec_t pVar26;
  
  if (((s->target).cipher)->aead == (ptls_aead_context_t *)0x0) {
    __assert_fail("s->target.cipher->aead != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0xbb0,
                  "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                 );
  }
  if (s->dst == s->dst_payload_from) {
    __assert_fail("s->dst != s->dst_payload_from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0xbb2,
                  "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                 );
  }
  puVar4 = s->dst;
  lVar19 = (long)puVar4 - (long)s->dst_payload_from;
  while (lVar19 < 2) {
    s->dst = puVar4 + 1;
    *puVar4 = '\0';
    puVar4 = s->dst;
    lVar19 = (long)puVar4 - (long)s->dst_payload_from;
  }
  if (mode == QUICLY_COMMIT_SEND_PACKET_MODE_FULL_SIZE) {
    if ((s->num_datagrams != 0) &&
       (s->datagrams[s->num_datagrams - 1].iov_len != (ulong)(conn->egress).max_udp_payload_size)) {
      __assert_fail("s->num_datagrams == 0 || s->datagrams[s->num_datagrams - 1].iov_len == conn->egress.max_udp_payload_size"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0xbb9,
                    "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                   );
    }
    uVar25 = (ulong)(conn->egress).max_udp_payload_size - 0x10;
    puVar5 = (s->payload_buf).datagram;
    if (uVar25 < (ulong)((long)puVar4 - (long)puVar5)) {
      __assert_fail("s->dst - s->payload_buf.datagram <= max_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0xbbb,
                    "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                   );
    }
    memset(puVar4,0,(size_t)(puVar5 + (uVar25 - (long)puVar4)));
    s->dst = (s->payload_buf).datagram + uVar25;
  }
  if ((char)*(s->target).first_byte_at < '\0') {
    puVar4 = s->dst_payload_from;
    iVar17 = (*(int *)&s->dst - (int)puVar4) + (int)((s->target).cipher)->aead->algo->tag_size + 2;
    puVar4[-4] = (byte)((uint)iVar17 >> 8) | 0x40;
    puVar4[-3] = (uint8_t)iVar17;
  }
  else {
    if (((conn->application->cipher).egress.key_update_pn.next <= (conn->egress).packet_number) &&
       (unaff_EBP = update_1rtt_egress_key(conn), unaff_EBP != 0)) {
      return unaff_EBP;
    }
    if (((conn->application->cipher).egress.key_phase & 1) != 0) {
      pbVar6 = (s->target).first_byte_at;
      *pbVar6 = *pbVar6 | 4;
    }
  }
  uVar3 = (ushort)(conn->egress).packet_number;
  *(ushort *)(s->dst_payload_from + -2) = uVar3 << 8 | uVar3 >> 8;
  psVar7 = (s->target).cipher;
  puVar4 = (s->payload_buf).datagram;
  ppVar8 = psVar7->aead;
  puVar5 = s->dst;
  sVar9 = ppVar8->algo->tag_size;
  s->dst = puVar5 + sVar9;
  uVar25 = (long)(puVar5 + sVar9) - (long)puVar4;
  if ((conn->egress).max_udp_payload_size < uVar25) {
    __assert_fail("datagram_size <= conn->egress.max_udp_payload_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0xbd4,
                  "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                 );
  }
  psVar10 = ((conn->super).ctx)->crypto_engine;
  pVar26.len = uVar25;
  pVar26.base = puVar4;
  (*psVar10->encrypt_packet)
            (psVar10,conn,psVar7->header_protection,ppVar8,pVar26,
             (long)(s->target).first_byte_at - (long)puVar4,(long)s->dst_payload_from - (long)puVar4
             ,(conn->egress).packet_number,(uint)(mode == QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED))
  ;
  if (((s->target).field_0x10 & 1) == 0) {
    uVar22 = 0;
  }
  else {
    uVar22 = (long)s->dst - (long)(s->target).first_byte_at;
    s->send_window = s->send_window - uVar22;
  }
  pqVar11 = (conn->egress).loss.sentmap._pending_packet;
  if (pqVar11 != (quicly_sent_t *)0x0) {
    if ((uint16_t)uVar22 != 0) {
      pbVar6 = (byte *)((long)&pqVar11->data + 0x11);
      *pbVar6 = *pbVar6 | 1;
      (((conn->egress).loss.sentmap._pending_packet)->data).packet.cc_bytes_in_flight =
           (uint16_t)uVar22;
      psVar1 = &(conn->egress).loss.sentmap.bytes_in_flight;
      *psVar1 = *psVar1 + (uVar22 & 0xffff);
    }
    pbVar6 = (byte *)((long)&((conn->egress).loss.sentmap._pending_packet)->data + 0x11);
    *pbVar6 = *pbVar6 | 2;
    (conn->egress).loss.sentmap._pending_packet = (quicly_sent_t *)0x0;
    psVar1 = &(conn->egress).loss.sentmap.num_packets;
    *psVar1 = *psVar1 + 1;
  }
  (*((conn->egress).cc.type)->cc_on_sent)
            (&(conn->egress).cc,&(conn->egress).loss,(uint32_t)uVar22,(conn->stash).now);
  pbVar6 = (s->target).first_byte_at;
  bVar23 = *pbVar6;
  uVar24 = 3;
  if ((char)bVar23 < '\0') {
    bVar23 = bVar23 & 0xf0;
    if (bVar23 == 0xc0) {
      uVar24 = 0;
    }
    else if (bVar23 == 0xd0) {
      uVar24 = 1;
    }
    else {
      if (bVar23 != 0xe0) {
        __assert_fail("!\"FIXME\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                      ,0x224,"uint8_t get_epoch(uint8_t)");
      }
      uVar24 = 2;
    }
  }
  p_Var12 = (conn->super).tracer.cb;
  if (p_Var12 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
    (*p_Var12)((conn->super).tracer.ctx,
               "{\"type\":\"packet-sent\", \"time\":%lld, \"pn\":%llu, \"len\":%llu, \"packet-type\":%llu, \"ack-only\":%lld}\n"
               ,(conn->stash).now,(conn->egress).packet_number,(long)s->dst - (long)pbVar6,uVar24,
               (ulong)(~*(uint *)&(s->target).field_0x10 & 1));
  }
  puVar2 = &(conn->egress).packet_number;
  *puVar2 = *puVar2 + 1;
  puVar2 = &(conn->super).stats.num_packets.sent;
  *puVar2 = *puVar2 + 1;
  if (mode != QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED) {
    puVar2 = &(conn->super).stats.num_bytes.sent;
    *puVar2 = *puVar2 + uVar25;
    piVar13 = s->datagrams;
    sVar9 = s->num_datagrams;
    s->num_datagrams = sVar9 + 1;
    piVar13[sVar9].iov_base = (s->payload_buf).datagram;
    piVar13[sVar9].iov_len = uVar25;
    (s->payload_buf).datagram = (s->payload_buf).datagram + uVar25;
    (s->target).cipher = (st_quicly_cipher_context_t *)0x0;
    (s->target).first_byte_at = (uint8_t *)0x0;
  }
  uVar25 = (conn->egress).packet_number;
  if ((((conn->egress).next_pn_to_skip <= uVar25) && (-1 < (char)(s->current).first_byte)) &&
     ((conn->super).state < QUICLY_STATE_CLOSING)) {
    map = &(conn->egress).loss.sentmap;
    iVar17 = quicly_sentmap_prepare(map,uVar25,(conn->stash).now,'\x03');
    if (iVar17 == 0) {
      psVar20 = (conn->egress).loss.sentmap.tail;
      if (((psVar20 == (st_quicly_sent_block_t *)0x0) || (psVar20->next_insert_at == 0x10)) &&
         (psVar20 = quicly_sentmap__new_block(map), psVar20 == (st_quicly_sent_block_t *)0x0)) {
        unaff_EBP = 0x201;
        bVar16 = false;
      }
      else {
        sVar9 = psVar20->next_insert_at;
        psVar20->num_entries = psVar20->num_entries + 1;
        psVar20->next_insert_at = psVar20->next_insert_at + 1;
        psVar20->entries[sVar9].acked = on_invalid_ack;
        pqVar11 = (conn->egress).loss.sentmap._pending_packet;
        if (pqVar11 == (quicly_sent_t *)0x0) {
          __assert_fail("quicly_sentmap_is_open(map)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                        ,0x10c,"void quicly_sentmap_commit(quicly_sentmap_t *, uint16_t)");
        }
        pbVar6 = (byte *)((long)&pqVar11->data + 0x11);
        *pbVar6 = *pbVar6 | 2;
        (conn->egress).loss.sentmap._pending_packet = (quicly_sent_t *)0x0;
        psVar1 = &(conn->egress).loss.sentmap.num_packets;
        *psVar1 = *psVar1 + 1;
        uVar14 = (conn->egress).packet_number;
        (conn->egress).packet_number = uVar14 + 1;
        uVar18 = (conn->egress).cc.cwnd;
        uVar3 = (conn->egress).max_udp_payload_size;
        lVar19 = *in_FS_OFFSET;
        if (in_FS_OFFSET[-2] == 0) {
          (*((conn->super).ctx)->tls->random_bytes)((void *)(lVar19 + -0x30),0x20);
          in_FS_OFFSET[-2] = 8;
        }
        uVar18 = uVar18 / uVar3;
        uVar21 = 0x20;
        if (0x20 < uVar18) {
          uVar21 = uVar18;
        }
        lVar15 = in_FS_OFFSET[-2];
        in_FS_OFFSET[-2] = lVar15 + -1;
        (conn->egress).next_pn_to_skip =
             uVar14 + (ulong)*(uint *)(lVar19 + -0x34 + lVar15 * 4) % (ulong)(uVar21 << 4) + 2;
        bVar16 = true;
      }
    }
    else {
      bVar16 = false;
      unaff_EBP = iVar17;
    }
    if (!bVar16) {
      return unaff_EBP;
    }
  }
  return 0;
}

Assistant:

static int commit_send_packet(quicly_conn_t *conn, quicly_send_context_t *s, enum en_quicly_send_packet_mode_t mode)
{
    size_t datagram_size, packet_bytes_in_flight;

    assert(s->target.cipher->aead != NULL);

    assert(s->dst != s->dst_payload_from);

    /* pad so that the pn + payload would be at least 4 bytes */
    while (s->dst - s->dst_payload_from < QUICLY_MAX_PN_SIZE - QUICLY_SEND_PN_SIZE)
        *s->dst++ = QUICLY_FRAME_TYPE_PADDING;

    if (mode == QUICLY_COMMIT_SEND_PACKET_MODE_FULL_SIZE) {
        assert(s->num_datagrams == 0 || s->datagrams[s->num_datagrams - 1].iov_len == conn->egress.max_udp_payload_size);
        const size_t max_size = conn->egress.max_udp_payload_size - QUICLY_AEAD_TAG_SIZE;
        assert(s->dst - s->payload_buf.datagram <= max_size);
        memset(s->dst, QUICLY_FRAME_TYPE_PADDING, s->payload_buf.datagram + max_size - s->dst);
        s->dst = s->payload_buf.datagram + max_size;
    }

    /* encode packet size, packet number, key-phase */
    if (QUICLY_PACKET_IS_LONG_HEADER(*s->target.first_byte_at)) {
        uint16_t length = s->dst - s->dst_payload_from + s->target.cipher->aead->algo->tag_size + QUICLY_SEND_PN_SIZE;
        /* length is always 2 bytes, see _do_prepare_packet */
        length |= 0x4000;
        quicly_encode16(s->dst_payload_from - QUICLY_SEND_PN_SIZE - 2, length);
    } else {
        if (conn->egress.packet_number >= conn->application->cipher.egress.key_update_pn.next) {
            int ret;
            if ((ret = update_1rtt_egress_key(conn)) != 0)
                return ret;
        }
        if ((conn->application->cipher.egress.key_phase & 1) != 0)
            *s->target.first_byte_at |= QUICLY_KEY_PHASE_BIT;
    }
    quicly_encode16(s->dst_payload_from - QUICLY_SEND_PN_SIZE, (uint16_t)conn->egress.packet_number);

    /* encrypt the packet */
    s->dst += s->target.cipher->aead->algo->tag_size;
    datagram_size = s->dst - s->payload_buf.datagram;
    assert(datagram_size <= conn->egress.max_udp_payload_size);

    conn->super.ctx->crypto_engine->encrypt_packet(conn->super.ctx->crypto_engine, conn, s->target.cipher->header_protection,
                                                   s->target.cipher->aead, ptls_iovec_init(s->payload_buf.datagram, datagram_size),
                                                   s->target.first_byte_at - s->payload_buf.datagram,
                                                   s->dst_payload_from - s->payload_buf.datagram, conn->egress.packet_number,
                                                   mode == QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED);

    /* update CC, commit sentmap */
    if (s->target.ack_eliciting) {
        packet_bytes_in_flight = s->dst - s->target.first_byte_at;
        s->send_window -= packet_bytes_in_flight;
    } else {
        packet_bytes_in_flight = 0;
    }
    if (quicly_sentmap_is_open(&conn->egress.loss.sentmap))
        quicly_sentmap_commit(&conn->egress.loss.sentmap, (uint16_t)packet_bytes_in_flight);

    conn->egress.cc.type->cc_on_sent(&conn->egress.cc, &conn->egress.loss, (uint32_t)packet_bytes_in_flight, conn->stash.now);
    QUICLY_PROBE(PACKET_SENT, conn, conn->stash.now, conn->egress.packet_number, s->dst - s->target.first_byte_at,
                 get_epoch(*s->target.first_byte_at), !s->target.ack_eliciting);

    ++conn->egress.packet_number;
    ++conn->super.stats.num_packets.sent;

    if (mode != QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED) {
        conn->super.stats.num_bytes.sent += datagram_size;
        s->datagrams[s->num_datagrams++] = (struct iovec){.iov_base = s->payload_buf.datagram, .iov_len = datagram_size};
        s->payload_buf.datagram += datagram_size;
        s->target.cipher = NULL;
        s->target.first_byte_at = NULL;
    }

    /* insert PN gap if necessary, registering the PN to the ack queue so that we'd close the connection in the event of receiving
     * an ACK for that gap. */
    if (conn->egress.packet_number >= conn->egress.next_pn_to_skip && !QUICLY_PACKET_IS_LONG_HEADER(s->current.first_byte) &&
        conn->super.state < QUICLY_STATE_CLOSING) {
        int ret;
        if ((ret = quicly_sentmap_prepare(&conn->egress.loss.sentmap, conn->egress.packet_number, conn->stash.now,
                                          QUICLY_EPOCH_1RTT)) != 0)
            return ret;
        if (quicly_sentmap_allocate(&conn->egress.loss.sentmap, on_invalid_ack) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        quicly_sentmap_commit(&conn->egress.loss.sentmap, 0);
        ++conn->egress.packet_number;
        conn->egress.next_pn_to_skip = calc_next_pn_to_skip(conn->super.ctx->tls, conn->egress.packet_number, conn->egress.cc.cwnd,
                                                            conn->egress.max_udp_payload_size);
    }

    return 0;
}